

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O1

void __thiscall HEkkDual::minorUpdateRows(HEkkDual *this)

{
  uint32_t *puVar1;
  __atomic_base<int> _Var2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  element_type *peVar6;
  HVectorBase<double> *pHVar7;
  HighsTask *pHVar8;
  HighsSplitDeque *pHVar9;
  HEkkDual *pHVar10;
  long *plVar11;
  ulong uVar12;
  ulong uVar13;
  HighsInt start;
  uint uVar14;
  vector<double,_std::allocator<double>_> *pvVar15;
  uint end;
  long lVar16;
  double dVar17;
  HVector *Row;
  double multi_xpivot [8];
  HighsInt multi_iwhich [8];
  HVector_ptr multi_vector [8];
  HVector_ptr local_110;
  TaskGroup local_108;
  anon_class_32_4_068a6c9c local_f8;
  double local_d8 [8];
  int aiStack_98 [8];
  HVectorBase<double> *local_78 [9];
  
  uVar14 = 0;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x48,0);
  local_110 = this->multi_finish[this->multi_nFinish].row_ep;
  iVar3 = local_110->count;
  if ((iVar3 < 0) || ((double)this->solver_num_row * 0.1 < (double)iVar3)) {
    if (0 < this->multi_num) {
      pvVar15 = &this->multi_choice[0].row_ep.array;
      lVar16 = 0;
      uVar14 = 0;
      do {
        if ((-1 < *(int *)((long)(pvVar15 + -4) + 8)) &&
           (dVar17 = HighsSparseMatrix::computeDot(this->a_matrix,pvVar15,this->variable_in),
           1e-14 <= ABS(dVar17))) {
          local_78[(int)uVar14] = (HVectorBase<double> *)((long)(pvVar15 + -2) + 0x10);
          local_d8[(int)uVar14] = -dVar17 / this->alpha_row;
          aiStack_98[(int)uVar14] = (int)lVar16;
          uVar14 = uVar14 + 1;
        }
        lVar16 = lVar16 + 1;
        pvVar15 = (vector<double,_std::allocator<double>_> *)((long)(pvVar15 + 0x18) + 8);
      } while (lVar16 < this->multi_num);
    }
    local_f8.multi_vector = (HVector_ptr (*) [8])local_78;
    local_f8.multi_xpivot = &local_d8;
    local_f8.Row = &local_110;
    local_f8.this = this;
    if ((int)uVar14 < 2) {
      if (uVar14 == 1) {
        HVectorBase<double>::saxpy<double,double>(local_78[0],local_d8[0],local_110);
        HVectorBase<double>::tight(local_78[0]);
        if (this->edge_weight_mode == kSteepestEdge) {
          dVar17 = HVectorBase<double>::norm2(local_78[0]);
          (*local_f8.multi_xpivot)[0] = dVar17;
        }
      }
    }
    else {
      HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
      plVar11 = (long *)__tls_get_addr(&PTR_00449ef0);
      local_108.workerDeque = (HighsSplitDeque *)*plVar11;
      local_108.dequeHead = ((local_108.workerDeque)->ownerData).head;
      uVar13 = (ulong)uVar14;
      do {
        pHVar9 = local_108.workerDeque;
        uVar4 = ((local_108.workerDeque)->ownerData).head;
        uVar12 = (ulong)uVar4;
        start = (HighsInt)(uVar13 >> 1);
        end = (uint)uVar13;
        if (uVar12 < 0x2000) {
          ((local_108.workerDeque)->ownerData).head = uVar4 + 1;
          ((local_108.workerDeque)->taskArray)._M_elems[uVar12].metadata.stealer.
          super___atomic_base<unsigned_long>._M_i = 0;
          *(undefined ***)((local_108.workerDeque)->taskArray)._M_elems[uVar12].taskData =
               &PTR_operator___00449430;
          *(HighsInt *)(((local_108.workerDeque)->taskArray)._M_elems[uVar12].taskData + 8) = start;
          *(uint *)(((local_108.workerDeque)->taskArray)._M_elems[uVar12].taskData + 0xc) = end;
          pHVar8 = ((local_108.workerDeque)->taskArray)._M_elems + uVar12;
          pHVar8->taskData[0x10] = '\x01';
          pHVar8->taskData[0x11] = '\0';
          pHVar8->taskData[0x12] = '\0';
          pHVar8->taskData[0x13] = '\0';
          *(anon_class_32_4_068a6c9c **)
           (((local_108.workerDeque)->taskArray)._M_elems[uVar12].taskData + 0x18) = &local_f8;
          if (((local_108.workerDeque)->ownerData).allStolenCopy == true) {
            uVar5 = ((local_108.workerDeque)->ownerData).head;
            ((local_108.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                 CONCAT44(uVar5 - 1,uVar5);
            ((local_108.workerDeque)->stealerData).allStolen._M_base._M_i = false;
            ((local_108.workerDeque)->ownerData).splitCopy =
                 ((local_108.workerDeque)->ownerData).head;
            ((local_108.workerDeque)->ownerData).allStolenCopy = false;
            if ((((local_108.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
              ((local_108.workerDeque)->splitRequest)._M_base._M_i = false;
            }
            peVar6 = ((local_108.workerDeque)->ownerData).workerBunk.
                     super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            LOCK();
            _Var2._M_i = (peVar6->haveJobs).super___atomic_base<int>._M_i;
            (peVar6->haveJobs).super___atomic_base<int>._M_i =
                 (peVar6->haveJobs).super___atomic_base<int>._M_i + 1;
            UNLOCK();
            if (_Var2._M_i < ((local_108.workerDeque)->ownerData).numWorkers + -1) {
              HighsSplitDeque::WorkerBunk::publishWork
                        (((local_108.workerDeque)->ownerData).workerBunk.
                         super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,local_108.workerDeque);
            }
          }
          else {
            HighsSplitDeque::growShared(local_108.workerDeque);
          }
        }
        else {
          if ((((local_108.workerDeque)->ownerData).splitCopy < 0x2000) &&
             (((local_108.workerDeque)->ownerData).allStolenCopy == false)) {
            HighsSplitDeque::growShared(local_108.workerDeque);
          }
          puVar1 = &(pHVar9->ownerData).head;
          *puVar1 = *puVar1 + 1;
          ::highs::parallel::for_each<HEkkDual::minorUpdateRows()::__0&>(start,end,&local_f8,1);
        }
        pHVar10 = local_f8.this;
        uVar13 = uVar13 >> 1;
      } while (3 < end);
      if (1 < end) {
        pHVar7 = (*local_f8.multi_vector)[0];
        HVectorBase<double>::saxpy<double,double>(pHVar7,(*local_f8.multi_xpivot)[0],*local_f8.Row);
        HVectorBase<double>::tight(pHVar7);
        if (pHVar10->edge_weight_mode == kSteepestEdge) {
          dVar17 = HVectorBase<double>::norm2(pHVar7);
          (*local_f8.multi_xpivot)[0] = dVar17;
        }
      }
      ::highs::parallel::TaskGroup::taskWait(&local_108);
      ::highs::parallel::TaskGroup::~TaskGroup(&local_108);
    }
    if (0 < (int)uVar14 && this->edge_weight_mode == kSteepestEdge) {
      uVar13 = 0;
      do {
        this->multi_choice[aiStack_98[uVar13]].infeasEdWt = local_d8[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
    }
  }
  else if (0 < this->multi_num) {
    pvVar15 = &this->multi_choice[0].row_ep.array;
    lVar16 = 0;
    do {
      if ((-1 < *(int *)((long)(pvVar15 + -4) + 8)) &&
         (dVar17 = HighsSparseMatrix::computeDot(this->a_matrix,pvVar15,this->variable_in),
         1e-14 <= ABS(dVar17))) {
        pHVar7 = (HVectorBase<double> *)((long)(pvVar15 + -2) + 0x10);
        HVectorBase<double>::saxpy<double,double>(pHVar7,-dVar17 / this->alpha_row,local_110);
        HVectorBase<double>::tight(pHVar7);
        if (this->edge_weight_mode == kSteepestEdge) {
          dVar17 = HVectorBase<double>::norm2(pHVar7);
          *(double *)(pvVar15 + -2) = dVar17;
        }
      }
      lVar16 = lVar16 + 1;
      pvVar15 = (vector<double,_std::allocator<double>_> *)((long)(pvVar15 + 0x18) + 8);
    } while (lVar16 < this->multi_num);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x48,0);
  return;
}

Assistant:

void HEkkDual::minorUpdateRows() {
  analysis->simplexTimerStart(UpdateRowClock);
  const HVector* Row = multi_finish[multi_nFinish].row_ep;
  HighsInt updateRows_inDense =
      (Row->count < 0) || (Row->count > 0.1 * solver_num_row);
  if (updateRows_inDense) {
    HighsInt multi_nTasks = 0;
    HighsInt multi_iwhich[kSimplexConcurrencyLimit];
    double multi_xpivot[kSimplexConcurrencyLimit];
    HVector_ptr multi_vector[kSimplexConcurrencyLimit];

    /*
     * Dense mode
     *  1. Find which ones to do and the pivotX
     *  2. Do all of them in task parallel
     */

    // Collect tasks
    for (HighsInt ich = 0; ich < multi_num; ich++) {
      if (multi_choice[ich].row_out >= 0) {
        HVector* next_ep = &multi_choice[ich].row_ep;
        double pivotX = a_matrix->computeDot(*next_ep, variable_in);
        if (fabs(pivotX) < kHighsTiny) continue;
        multi_vector[multi_nTasks] = next_ep;
        multi_xpivot[multi_nTasks] = -pivotX / alpha_row;
        multi_iwhich[multi_nTasks] = ich;
        multi_nTasks++;
      }
    }

    // Perform tasks
    // #pragma omp parallel for schedule(dynamic)
    // printf("minorUpdatesRows: starting %d tasks\n", multi_nTasks);
    highs::parallel::for_each(
        0, multi_nTasks, [&](HighsInt start, HighsInt end) {
          for (HighsInt i = start; i < end; i++) {
            HVector_ptr nextEp = multi_vector[i];
            const double xpivot = multi_xpivot[i];
            nextEp->saxpy(xpivot, Row);
            nextEp->tight();
            if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
              multi_xpivot[i] = nextEp->norm2();
            }
          }
        });

    // Put weight back
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      for (HighsInt i = 0; i < multi_nTasks; i++)
        multi_choice[multi_iwhich[i]].infeasEdWt = multi_xpivot[i];
    }
  } else {
    // Sparse mode: just do it sequentially
    for (HighsInt ich = 0; ich < multi_num; ich++) {
      if (multi_choice[ich].row_out >= 0) {
        HVector* next_ep = &multi_choice[ich].row_ep;
        double pivotX = a_matrix->computeDot(*next_ep, variable_in);
        if (fabs(pivotX) < kHighsTiny) continue;
        next_ep->saxpy(-pivotX / alpha_row, Row);
        next_ep->tight();
        if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
          multi_choice[ich].infeasEdWt = next_ep->norm2();
        }
      }
    }
  }
  analysis->simplexTimerStop(UpdateRowClock);
}